

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O2

void __thiscall arma::Mat<double>::Mat<true>(Mat<double> *this,xtrans_mat<double,_true> *X)

{
  this->n_rows = X->n_rows;
  this->n_cols = X->n_cols;
  this->n_elem = X->n_elem;
  this->mem = (double *)0x0;
  this->n_alloc = 0;
  this->vec_state = 0;
  this->mem_state = 0;
  init_cold(this);
  xtrans_mat<double,_true>::extract(X,this);
  return;
}

Assistant:

inline
Mat<eT>::Mat(const xtrans_mat<eT,do_conj>& X)
  : n_rows(X.n_rows)
  , n_cols(X.n_cols)
  , n_elem(X.n_elem)
  , n_alloc()
  , vec_state(0)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  init_cold();
  
  X.extract(*this);
  }